

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O2

void __thiscall
bloaty::RangeMapTest_UnknownSize2_Test::TestBody(RangeMapTest_UnknownSize2_Test *this)

{
  RangeMap *this_00;
  uint64_t size;
  long lVar1;
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  allocator_type local_a3;
  allocator<char> local_a2;
  allocator<char> local_a1;
  vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> local_a0;
  undefined1 local_88 [24];
  string local_70 [32];
  undefined8 local_50;
  undefined8 local_48;
  uint64_t local_40;
  string local_38 [32];
  
  size = (this->super_RangeMapTest).kUnknownSize;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"foo",(allocator<char> *)&local_a0);
  this_00 = &(this->super_RangeMapTest).map_;
  RangeMap::AddRange(this_00,100,size,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"bar",(allocator<char> *)&local_a0);
  RangeMap::AddRange(this_00,0x5f,10,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  local_88._0_8_ = (pointer)0x5f;
  local_88._8_8_ = 100;
  local_88._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  std::__cxx11::string::string<std::allocator<char>>(local_70,"bar",&local_a1);
  local_50 = 100;
  local_48 = 0x69;
  local_40 = (this->super_RangeMapTest).kNoTranslation;
  std::__cxx11::string::string<std::allocator<char>>(local_38,"foo",&local_a2);
  __l._M_len = 2;
  __l._M_array = (iterator)local_88;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            (&local_a0,__l,&local_a3);
  RangeMapTest::AssertMainMapEquals(&this->super_RangeMapTest,&local_a0);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            (&local_a0);
  lVar1 = 0x50;
  do {
    std::__cxx11::string::~string((string *)(local_88 + lVar1));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

TEST_F(RangeMapTest, UnknownSize2) {
  // This case is slightly weird, but we do consider the "100" below to be a
  // hard fact even if the size is unknown, so the "[95, 105]: bar" range
  // doesn't override it.
  map_.AddRange(100, kUnknownSize, "foo");
  map_.AddRange(95, 10, "bar");
  AssertMainMapEquals({
    {95, 100, kNoTranslation, "bar"},
    {100, 105, kNoTranslation, "foo"},
  });
}